

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O3

CURLcode Curl_http_readwrite_headers
                   (Curl_easy *data,connectdata *conn,ssize_t *nread,_Bool *stop_reading)

{
  dynbuf *s;
  undefined1 *puVar1;
  int *piVar2;
  curl_off_t *pcVar3;
  ushort uVar4;
  curlntlm cVar5;
  uint uVar6;
  size_t __n;
  connectdata *conn_00;
  size_t *psVar7;
  _Bool _Var8;
  CURLcode CVar9;
  statusline sVar10;
  int iVar11;
  uint uVar12;
  int iVar13;
  uint uVar14;
  void *pvVar15;
  char *pcVar16;
  size_t sVar17;
  char *pcVar18;
  byte bVar19;
  curl_off_t cVar20;
  char digit4;
  char separator;
  char twoorthree [2];
  int httpversion;
  int httpversion_major;
  int rtspversion_major;
  char local_7c;
  char local_7b;
  char local_7a [2];
  int *local_78;
  uint local_70;
  int local_6c;
  connectdata *local_68;
  SingleRequest *local_60;
  size_t *local_58;
  char *local_50;
  size_t local_48;
  _Bool *local_40;
  undefined1 local_34 [4];
  
  local_60 = &data->req;
  local_48 = *nread;
  pcVar18 = (data->req).str;
  s = &(data->state).headerb;
  local_78 = &(data->req).httpcode;
  local_68 = conn;
  local_58 = (size_t *)nread;
  local_50 = pcVar18;
  local_40 = stop_reading;
  do {
    psVar7 = local_58;
    __n = *local_58;
    pvVar15 = memchr(pcVar18,10,__n);
    if (pvVar15 == (void *)0x0) {
      CVar9 = Curl_dyn_addn(s,pcVar18,__n);
      if (CVar9 != CURLE_OK) {
        return CVar9;
      }
      if ((data->req).headerline != 0) {
        return CURLE_OK;
      }
      pcVar18 = Curl_dyn_ptr(s);
      sVar17 = Curl_dyn_len(s);
      sVar10 = checkhttpprefix(data,pcVar18,sVar17);
      if (sVar10 != STATUS_BAD) {
        return CURLE_OK;
      }
      puVar1 = &(data->req).field_0xd9;
      *puVar1 = *puVar1 & 0xfe;
      (data->req).badheader = HEADER_ALLBAD;
      Curl_conncontrol(conn,2);
      if (((data->set).field_0x8e8 & 0x20) != 0) {
        return CURLE_OK;
      }
LAB_00534000:
      pcVar18 = "Received HTTP/0.9 when not allowed";
      goto LAB_0053409f;
    }
    *psVar7 = (size_t)(pcVar18 + ~(ulong)pvVar15 + __n);
    (data->req).str = (char *)((long)pvVar15 + 1);
    CVar9 = Curl_dyn_addn(s,pcVar18,((long)pvVar15 + 1) - (long)pcVar18);
    if (CVar9 != CURLE_OK) {
      return CVar9;
    }
    if ((data->req).headerline == 0) {
      pcVar16 = Curl_dyn_ptr(s);
      sVar17 = Curl_dyn_len(s);
      sVar10 = checkhttpprefix(data,pcVar16,sVar17);
      if (sVar10 == STATUS_BAD) {
        Curl_conncontrol(conn,2);
        if (((data->set).field_0x8e8 & 0x20) != 0) {
          puVar1 = &(data->req).field_0xd9;
          *puVar1 = *puVar1 & 0xfe;
          if (*psVar7 != 0) {
            (data->req).badheader = HEADER_PARTHEADER;
            return CURLE_OK;
          }
          (data->req).badheader = HEADER_ALLBAD;
          *psVar7 = local_48;
          (data->req).str = local_50;
          return CURLE_OK;
        }
        goto LAB_00534000;
      }
    }
    pcVar16 = Curl_dyn_ptr(s);
    psVar7 = local_58;
    conn_00 = local_68;
    if ((*pcVar16 == '\r') || (*pcVar16 == '\n')) {
      uVar12 = *local_78;
      if (uVar12 - 100 < 100) {
        if ((char)uVar12 == 'e') {
          if ((data->req).upgr101 == UPGR101_H2) {
            Curl_infof(data,"Received 101, Switching to HTTP/2");
            (data->req).upgr101 = UPGR101_RECEIVED;
            puVar1 = &(data->req).field_0xd9;
            *puVar1 = *puVar1 | 1;
            (data->req).headerline = 0;
            CVar9 = Curl_http2_switched(data,(data->req).str,*psVar7);
            if (CVar9 != CURLE_OK) {
              return CVar9;
            }
            *psVar7 = 0;
          }
          else {
            puVar1 = &(data->req).field_0xd9;
            *puVar1 = *puVar1 & 0xfe;
          }
        }
        else if ((uVar12 & 0xff) == 100) {
          puVar1 = &(data->req).field_0xd9;
          *puVar1 = *puVar1 | 1;
          (data->req).headerline = 0;
          if ((data->req).exp100 != EXP100_SEND_DATA) {
            (data->req).exp100 = EXP100_SEND_DATA;
            piVar2 = &(data->req).keepon;
            *(byte *)piVar2 = (byte)*piVar2 | 2;
            Curl_expire_done(data,EXPIRE_100_TIMEOUT);
          }
        }
        else {
          puVar1 = &(data->req).field_0xd9;
          *puVar1 = *puVar1 | 1;
          (data->req).headerline = 0;
        }
      }
      else {
        uVar4 = *(ushort *)&(data->req).field_0xd9;
        *(ushort *)&(data->req).field_0xd9 = uVar4 & 0xfffe;
        if (((((uVar4 & 0x20) == 0 && (data->req).size == -1) &&
             (((conn->bits).field_0x4 & 0x40) == 0)) && (conn->httpversion == '\v')) &&
           (((conn->handler->protocol & 0x40000) == 0 && ((data->state).httpreq != '\x05')))) {
          Curl_infof(data,"no chunk, no close, no size. Assume close to signal end");
          Curl_conncontrol(conn,2);
        }
      }
      if ((((data->req).field_0xd9 & 1) == 0) && (CVar9 = Curl_http_size(data), CVar9 != CURLE_OK))
      {
        return CVar9;
      }
      uVar12 = *local_78;
      if (((conn->bits).field_0x4 & 0x40) != 0) {
        if (uVar12 == 0x197) {
          uVar12 = 0x197;
          cVar5 = conn->proxy_ntlm_state;
        }
        else {
          if (uVar12 != 0x191) goto LAB_00533a14;
          uVar12 = 0x191;
          cVar5 = conn->http_ntlm_state;
        }
        if (cVar5 == NTLMSTATE_TYPE2) {
          Curl_infof(data,"Connection closure while negotiating auth (HTTP 1.0?)");
          puVar1 = &(data->state).field_0x6d0;
          *puVar1 = *puVar1 | 0x20;
          uVar12 = (data->req).httpcode;
        }
      }
LAB_00533a14:
      uVar6 = *(uint *)&(data->set).field_0x8e2;
      sVar17 = Curl_dyn_len(s);
      pcVar16 = Curl_dyn_ptr(s);
      CVar9 = Curl_client_write(data,(uVar6 >> 0x16 & 1) + (uint)(uVar12 - 100 < 100) * 0x10 + 2,
                                pcVar16,sVar17);
      if (CVar9 != CURLE_OK) {
        return CVar9;
      }
      pcVar3 = &(data->info).header_size;
      *pcVar3 = *pcVar3 + sVar17;
      cVar20 = (data->req).headerbytecount + sVar17;
      (data->req).headerbytecount = cVar20;
      _Var8 = http_should_fail(data);
      if (_Var8) {
        Curl_failf(data,"The requested URL returned error: %d");
        return CURLE_HTTP_RETURNED_ERROR;
      }
      if (99 < (data->req).httpcode - 100U) {
        cVar20 = 0;
      }
      (data->req).deductheadercount = cVar20;
      CVar9 = Curl_http_auth_act(data);
      if (CVar9 != CURLE_OK) {
        return CVar9;
      }
      if (299 < *local_78) {
        if ((((*(uint *)&(conn->bits).field_0x4 & 0x30040) == 0) &&
            ((byte)((data->state).httpreq - 1) < 4)) &&
           (Curl_expire_done(data,EXPIRE_100_TIMEOUT), ((data->req).field_0xd9 & 4) == 0)) {
          if ((*local_78 == 0x1a1) && (((data->state).field_0x6d0 & 0x80) != 0)) {
            Curl_infof(data,"Got 417 while waiting for a 100");
            puVar1 = &(data->state).field_0x6d1;
            *puVar1 = *puVar1 | 1;
            pcVar16 = (*Curl_cstrdup)((data->state).url);
            (data->req).newurl = pcVar16;
            Curl_done_sending(data,local_60);
          }
          else if (((data->set).field_0x8e4 & 4) == 0) {
            Curl_infof(data,"HTTP error before end of send, stop sending");
            Curl_conncontrol(conn,2);
            CVar9 = Curl_done_sending(data,local_60);
            if (CVar9 != CURLE_OK) {
              return CVar9;
            }
            puVar1 = &(data->req).field_0xd9;
            *puVar1 = *puVar1 | 4;
            if (((data->state).field_0x6d0 & 0x80) != 0) {
              (data->req).exp100 = EXP100_FAILED;
            }
          }
          else {
            Curl_infof(data,"HTTP error before end of send, keep sending");
            if ((data->req).exp100 != EXP100_SEND_DATA) {
              (data->req).exp100 = EXP100_SEND_DATA;
              piVar2 = &(data->req).keepon;
              *(byte *)piVar2 = (byte)*piVar2 | 2;
            }
          }
        }
        if (((conn->bits).field_0x6 & 2) != 0) {
          Curl_infof(data,"Keep sending data to get tossed away");
          piVar2 = &(data->req).keepon;
          *(byte *)piVar2 = (byte)*piVar2 | 2;
        }
      }
      if (((data->req).field_0xd9 & 1) == 0) {
        if (((data->set).field_0x8e5 & 2) != 0) {
          *local_40 = true;
        }
        if (((data->req).maxdownload == 0) &&
           (((conn->handler->protocol & 3) == 0 || (conn->httpversion != '\x14')))) {
          *local_40 = true;
        }
        if (*local_40 == true) {
          piVar2 = &(data->req).keepon;
          *(byte *)piVar2 = (byte)*piVar2 & 0xfe;
        }
        Curl_debug(data,CURLINFO_HEADER_IN,pcVar18,sVar17);
        return CURLE_OK;
      }
    }
    else {
      iVar11 = (data->req).headerline;
      (data->req).headerline = iVar11 + 1;
      uVar12 = 2;
      if (iVar11 == 0) {
        uVar12 = local_68->handler->protocol;
        if ((uVar12 & 3) != 0) {
          local_70 = 0;
          local_7c = '\0';
          iVar11 = __isoc99_sscanf(pcVar16," HTTP/%1d.%1d%c%3d%c",&local_6c,&local_70,&local_7b,
                                   local_78,&local_7c);
          if ((iVar11 == 1) && (1 < local_6c)) {
            iVar11 = __isoc99_sscanf(pcVar16," HTTP/%1[23] %d",local_7a,local_78);
            if (iVar11 == 2) {
              conn_00->httpversion = '\0';
              local_7b = ' ';
              iVar11 = 4;
LAB_00533c21:
              local_70 = local_6c * 10 + local_70;
              bVar19 = (byte)local_70;
              if ((0x14 < local_70) || ((0x100c00U >> (local_70 & 0x1f) & 1) == 0)) {
                Curl_failf(data,"Unsupported HTTP version (%u.%d) in response",
                           (ulong)(uint)((int)local_70 / 10),(ulong)(uint)((int)local_70 % 10));
                return CURLE_UNSUPPORTED_PROTOCOL;
              }
              conn_00->httpversion = bVar19;
              if ((local_70 != 0x14) && ((data->req).upgr101 == UPGR101_RECEIVED)) {
                Curl_infof(data,"Lying server, not serving HTTP/2");
                bVar19 = conn_00->httpversion;
              }
              if (bVar19 < 0x14) {
                conn_00->bundle->multiuse = -1;
                Curl_infof(data,"Mark bundle as not supporting multiuse");
              }
              goto LAB_00533d14;
            }
            if (9 < (byte)(local_7c - 0x30U)) goto LAB_00534098;
          }
          else if (9 < (byte)(local_7c - 0x30U)) {
            if (iVar11 < 4) {
              if (iVar11 == 0) {
                iVar11 = __isoc99_sscanf(pcVar16," HTTP %3d",local_78);
                conn_00->httpversion = '\n';
                if (iVar11 == 0) {
                  pcVar18 = Curl_dyn_ptr(s);
                  sVar17 = Curl_dyn_len(s);
                  sVar10 = checkhttpprefix(data,pcVar18,sVar17);
                  iVar11 = 0;
                  if (sVar10 == STATUS_DONE) {
                    *local_78 = 200;
                    conn_00->httpversion = '\n';
                    iVar11 = 1;
                  }
                }
                goto LAB_00533d14;
              }
            }
            else {
              if (*local_78 < 100) goto LAB_0053408f;
              if (local_7b == ' ') goto LAB_00533c21;
            }
LAB_00534098:
            pcVar18 = "Unsupported HTTP version in response";
            goto LAB_0053409f;
          }
LAB_0053408f:
          pcVar18 = "Unsupported response code in HTTP response";
LAB_0053409f:
          Curl_failf(data,pcVar18);
          return CURLE_UNSUPPORTED_PROTOCOL;
        }
        if ((uVar12 >> 0x12 & 1) == 0) goto LAB_0053402f;
        iVar11 = 0;
        iVar13 = __isoc99_sscanf(pcVar16," RTSP/%1d.%1d%c%3d",local_34,&local_70,local_7a,local_78);
        if ((iVar13 == 4) && (local_7a[0] == ' ')) {
          conn_00->httpversion = '\v';
          iVar11 = 4;
        }
LAB_00533d14:
        if (iVar11 == 0) {
LAB_0053402f:
          puVar1 = &(data->req).field_0xd9;
          *puVar1 = *puVar1 & 0xfe;
          return CURLE_OK;
        }
        Curl_http_statusline(data,conn_00);
        uVar12 = 6;
      }
      pcVar18 = Curl_dyn_ptr(s);
      sVar17 = Curl_dyn_len(s);
      pvVar15 = memchr(pcVar18,0,sVar17);
      if (pvVar15 != (void *)0x0) {
        pcVar18 = "Nul byte in header";
LAB_0053403f:
        Curl_failf(data,pcVar18);
        return CURLE_WEIRD_SERVER_REPLY;
      }
      iVar11 = (data->req).headerline;
      if ((1 < iVar11) &&
         ((((*pcVar18 != ' ' && (*pcVar18 != '\t')) || (iVar11 == 2)) &&
          (pvVar15 = memchr(pcVar18,0x3a,sVar17), pvVar15 == (void *)0x0)))) {
        pcVar18 = "Header without colon";
        goto LAB_0053403f;
      }
      CVar9 = Curl_http_header(data,local_68,pcVar16);
      if (CVar9 != CURLE_OK) {
        return CVar9;
      }
      uVar14 = *(uint *)&(data->set).field_0x8e2 >> 0x16 & 1;
      uVar6 = uVar14 + uVar12 + 0x10;
      if (99 < (data->req).httpcode - 100U) {
        uVar6 = uVar14 | uVar12;
      }
      sVar17 = Curl_dyn_len(s);
      Curl_debug(data,CURLINFO_HEADER_IN,pcVar16,sVar17);
      sVar17 = Curl_dyn_len(s);
      CVar9 = Curl_client_write(data,uVar6,pcVar16,sVar17);
      if (CVar9 != CURLE_OK) {
        return CVar9;
      }
      sVar17 = Curl_dyn_len(s);
      pcVar3 = &(data->info).header_size;
      *pcVar3 = *pcVar3 + sVar17;
      sVar17 = Curl_dyn_len(s);
      pcVar3 = &(data->req).headerbytecount;
      *pcVar3 = *pcVar3 + sVar17;
      conn = local_68;
    }
    Curl_dyn_reset(s);
    pcVar18 = (data->req).str;
    if (*pcVar18 == '\0') {
      return CURLE_OK;
    }
  } while( true );
}

Assistant:

CURLcode Curl_http_readwrite_headers(struct Curl_easy *data,
                                     struct connectdata *conn,
                                     ssize_t *nread,
                                     bool *stop_reading)
{
  CURLcode result;
  struct SingleRequest *k = &data->req;
  ssize_t onread = *nread;
  char *ostr = k->str;
  char *headp;
  char *str_start;
  char *end_ptr;

  /* header line within buffer loop */
  do {
    size_t rest_length;
    size_t full_length;
    int writetype;

    /* str_start is start of line within buf */
    str_start = k->str;

    /* data is in network encoding so use 0x0a instead of '\n' */
    end_ptr = memchr(str_start, 0x0a, *nread);

    if(!end_ptr) {
      /* Not a complete header line within buffer, append the data to
         the end of the headerbuff. */
      result = Curl_dyn_addn(&data->state.headerb, str_start, *nread);
      if(result)
        return result;

      if(!k->headerline) {
        /* check if this looks like a protocol header */
        statusline st =
          checkprotoprefix(data, conn,
                           Curl_dyn_ptr(&data->state.headerb),
                           Curl_dyn_len(&data->state.headerb));

        if(st == STATUS_BAD) {
          /* this is not the beginning of a protocol first header line */
          k->header = FALSE;
          k->badheader = HEADER_ALLBAD;
          streamclose(conn, "bad HTTP: No end-of-message indicator");
          if(!data->set.http09_allowed) {
            failf(data, "Received HTTP/0.9 when not allowed");
            return CURLE_UNSUPPORTED_PROTOCOL;
          }
          break;
        }
      }

      break; /* read more and try again */
    }

    /* decrease the size of the remaining (supposed) header line */
    rest_length = (end_ptr - k->str) + 1;
    *nread -= (ssize_t)rest_length;

    k->str = end_ptr + 1; /* move past new line */

    full_length = k->str - str_start;

    result = Curl_dyn_addn(&data->state.headerb, str_start, full_length);
    if(result)
      return result;

    /****
     * We now have a FULL header line in 'headerb'.
     *****/

    if(!k->headerline) {
      /* the first read header */
      statusline st = checkprotoprefix(data, conn,
                                       Curl_dyn_ptr(&data->state.headerb),
                                       Curl_dyn_len(&data->state.headerb));
      if(st == STATUS_BAD) {
        streamclose(conn, "bad HTTP: No end-of-message indicator");
        /* this is not the beginning of a protocol first header line */
        if(!data->set.http09_allowed) {
          failf(data, "Received HTTP/0.9 when not allowed");
          return CURLE_UNSUPPORTED_PROTOCOL;
        }
        k->header = FALSE;
        if(*nread)
          /* since there's more, this is a partial bad header */
          k->badheader = HEADER_PARTHEADER;
        else {
          /* this was all we read so it's all a bad header */
          k->badheader = HEADER_ALLBAD;
          *nread = onread;
          k->str = ostr;
          return CURLE_OK;
        }
        break;
      }
    }

    /* headers are in network encoding so use 0x0a and 0x0d instead of '\n'
       and '\r' */
    headp = Curl_dyn_ptr(&data->state.headerb);
    if((0x0a == *headp) || (0x0d == *headp)) {
      size_t headerlen;
      /* Zero-length header line means end of headers! */

      if('\r' == *headp)
        headp++; /* pass the \r byte */
      if('\n' == *headp)
        headp++; /* pass the \n byte */

      if(100 <= k->httpcode && 199 >= k->httpcode) {
        /* "A user agent MAY ignore unexpected 1xx status responses." */
        switch(k->httpcode) {
        case 100:
          /*
           * We have made a HTTP PUT or POST and this is 1.1-lingo
           * that tells us that the server is OK with this and ready
           * to receive the data.
           * However, we'll get more headers now so we must get
           * back into the header-parsing state!
           */
          k->header = TRUE;
          k->headerline = 0; /* restart the header line counter */

          /* if we did wait for this do enable write now! */
          if(k->exp100 > EXP100_SEND_DATA) {
            k->exp100 = EXP100_SEND_DATA;
            k->keepon |= KEEP_SEND;
            Curl_expire_done(data, EXPIRE_100_TIMEOUT);
          }
          break;
        case 101:
          /* Switching Protocols */
          if(k->upgr101 == UPGR101_H2) {
            /* Switching to HTTP/2 */
            infof(data, "Received 101, Switching to HTTP/2");
            k->upgr101 = UPGR101_RECEIVED;

            /* we'll get more headers (HTTP/2 response) */
            k->header = TRUE;
            k->headerline = 0; /* restart the header line counter */

            /* switch to http2 now. The bytes after response headers
               are also processed here, otherwise they are lost. */
            result = Curl_http2_switched(data, k->str, *nread);
            if(result)
              return result;
            *nread = 0;
          }
#ifdef USE_WEBSOCKETS
          else if(k->upgr101 == UPGR101_WS) {
            /* verify the response */
            result = Curl_ws_accept(data);
            if(result)
              return result;
            k->header = FALSE; /* no more header to parse! */
            if(data->set.connect_only) {
              k->keepon &= ~KEEP_RECV; /* read no more content */
              *nread = 0;
            }
          }
#endif
          else {
            /* Not switching to another protocol */
            k->header = FALSE; /* no more header to parse! */
          }
          break;
        default:
          /* the status code 1xx indicates a provisional response, so
             we'll get another set of headers */
          k->header = TRUE;
          k->headerline = 0; /* restart the header line counter */
          break;
        }
      }
      else {
        k->header = FALSE; /* no more header to parse! */

        if((k->size == -1) && !k->chunk && !conn->bits.close &&
           (conn->httpversion == 11) &&
           !(conn->handler->protocol & CURLPROTO_RTSP) &&
           data->state.httpreq != HTTPREQ_HEAD) {
          /* On HTTP 1.1, when connection is not to get closed, but no
             Content-Length nor Transfer-Encoding chunked have been
             received, according to RFC2616 section 4.4 point 5, we
             assume that the server will close the connection to
             signal the end of the document. */
          infof(data, "no chunk, no close, no size. Assume close to "
                "signal end");
          streamclose(conn, "HTTP: No end-of-message indicator");
        }
      }

      if(!k->header) {
        result = Curl_http_size(data);
        if(result)
          return result;
      }

      /* At this point we have some idea about the fate of the connection.
         If we are closing the connection it may result auth failure. */
#if defined(USE_NTLM)
      if(conn->bits.close &&
         (((data->req.httpcode == 401) &&
           (conn->http_ntlm_state == NTLMSTATE_TYPE2)) ||
          ((data->req.httpcode == 407) &&
           (conn->proxy_ntlm_state == NTLMSTATE_TYPE2)))) {
        infof(data, "Connection closure while negotiating auth (HTTP 1.0?)");
        data->state.authproblem = TRUE;
      }
#endif
#if defined(USE_SPNEGO)
      if(conn->bits.close &&
        (((data->req.httpcode == 401) &&
          (conn->http_negotiate_state == GSS_AUTHRECV)) ||
         ((data->req.httpcode == 407) &&
          (conn->proxy_negotiate_state == GSS_AUTHRECV)))) {
        infof(data, "Connection closure while negotiating auth (HTTP 1.0?)");
        data->state.authproblem = TRUE;
      }
      if((conn->http_negotiate_state == GSS_AUTHDONE) &&
         (data->req.httpcode != 401)) {
        conn->http_negotiate_state = GSS_AUTHSUCC;
      }
      if((conn->proxy_negotiate_state == GSS_AUTHDONE) &&
         (data->req.httpcode != 407)) {
        conn->proxy_negotiate_state = GSS_AUTHSUCC;
      }
#endif

      /* now, only output this if the header AND body are requested:
       */
      writetype = CLIENTWRITE_HEADER |
        (data->set.include_header ? CLIENTWRITE_BODY : 0) |
        ((k->httpcode/100 == 1) ? CLIENTWRITE_1XX : 0);

      headerlen = Curl_dyn_len(&data->state.headerb);
      result = Curl_client_write(data, writetype,
                                 Curl_dyn_ptr(&data->state.headerb),
                                 headerlen);
      if(result)
        return result;

      data->info.header_size += (long)headerlen;
      data->req.headerbytecount += (long)headerlen;

      /*
       * When all the headers have been parsed, see if we should give
       * up and return an error.
       */
      if(http_should_fail(data)) {
        failf(data, "The requested URL returned error: %d",
              k->httpcode);
        return CURLE_HTTP_RETURNED_ERROR;
      }

#ifdef USE_WEBSOCKETS
      /* All non-101 HTTP status codes are bad when wanting to upgrade to
         websockets */
      if(data->req.upgr101 == UPGR101_WS) {
        failf(data, "Refused WebSockets upgrade: %d", k->httpcode);
        return CURLE_HTTP_RETURNED_ERROR;
      }
#endif


      data->req.deductheadercount =
        (100 <= k->httpcode && 199 >= k->httpcode)?data->req.headerbytecount:0;

      /* Curl_http_auth_act() checks what authentication methods
       * that are available and decides which one (if any) to
       * use. It will set 'newurl' if an auth method was picked. */
      result = Curl_http_auth_act(data);

      if(result)
        return result;

      if(k->httpcode >= 300) {
        if((!conn->bits.authneg) && !conn->bits.close &&
           !conn->bits.rewindaftersend) {
          /*
           * General treatment of errors when about to send data. Including :
           * "417 Expectation Failed", while waiting for 100-continue.
           *
           * The check for close above is done simply because of something
           * else has already deemed the connection to get closed then
           * something else should've considered the big picture and we
           * avoid this check.
           *
           * rewindaftersend indicates that something has told libcurl to
           * continue sending even if it gets discarded
           */

          switch(data->state.httpreq) {
          case HTTPREQ_PUT:
          case HTTPREQ_POST:
          case HTTPREQ_POST_FORM:
          case HTTPREQ_POST_MIME:
            /* We got an error response. If this happened before the whole
             * request body has been sent we stop sending and mark the
             * connection for closure after we've read the entire response.
             */
            Curl_expire_done(data, EXPIRE_100_TIMEOUT);
            if(!k->upload_done) {
              if((k->httpcode == 417) && data->state.expect100header) {
                /* 417 Expectation Failed - try again without the Expect
                   header */
                infof(data, "Got 417 while waiting for a 100");
                data->state.disableexpect = TRUE;
                DEBUGASSERT(!data->req.newurl);
                data->req.newurl = strdup(data->state.url);
                Curl_done_sending(data, k);
              }
              else if(data->set.http_keep_sending_on_error) {
                infof(data, "HTTP error before end of send, keep sending");
                if(k->exp100 > EXP100_SEND_DATA) {
                  k->exp100 = EXP100_SEND_DATA;
                  k->keepon |= KEEP_SEND;
                }
              }
              else {
                infof(data, "HTTP error before end of send, stop sending");
                streamclose(conn, "Stop sending data before everything sent");
                result = Curl_done_sending(data, k);
                if(result)
                  return result;
                k->upload_done = TRUE;
                if(data->state.expect100header)
                  k->exp100 = EXP100_FAILED;
              }
            }
            break;

          default: /* default label present to avoid compiler warnings */
            break;
          }
        }

        if(conn->bits.rewindaftersend) {
          /* We rewind after a complete send, so thus we continue
             sending now */
          infof(data, "Keep sending data to get tossed away");
          k->keepon |= KEEP_SEND;
        }
      }

      if(!k->header) {
        /*
         * really end-of-headers.
         *
         * If we requested a "no body", this is a good time to get
         * out and return home.
         */
        if(data->set.opt_no_body)
          *stop_reading = TRUE;
#ifndef CURL_DISABLE_RTSP
        else if((conn->handler->protocol & CURLPROTO_RTSP) &&
                (data->set.rtspreq == RTSPREQ_DESCRIBE) &&
                (k->size <= -1))
          /* Respect section 4.4 of rfc2326: If the Content-Length header is
             absent, a length 0 must be assumed.  It will prevent libcurl from
             hanging on DESCRIBE request that got refused for whatever
             reason */
          *stop_reading = TRUE;
#endif

        /* If max download size is *zero* (nothing) we already have
           nothing and can safely return ok now!  But for HTTP/2, we'd
           like to call http2_handle_stream_close to properly close a
           stream.  In order to do this, we keep reading until we
           close the stream. */
        if(0 == k->maxdownload
#if defined(USE_NGHTTP2)
           && !((conn->handler->protocol & PROTO_FAMILY_HTTP) &&
                conn->httpversion == 20)
#endif
           )
          *stop_reading = TRUE;

        if(*stop_reading) {
          /* we make sure that this socket isn't read more now */
          k->keepon &= ~KEEP_RECV;
        }

        Curl_debug(data, CURLINFO_HEADER_IN, str_start, headerlen);
        break; /* exit header line loop */
      }

      /* We continue reading headers, reset the line-based header */
      Curl_dyn_reset(&data->state.headerb);
      continue;
    }

    /*
     * Checks for special headers coming up.
     */

    writetype = CLIENTWRITE_HEADER;
    if(!k->headerline++) {
      /* This is the first header, it MUST be the error code line
         or else we consider this to be the body right away! */
      int httpversion_major;
      int rtspversion_major;
      int nc = 0;
#define HEADER1 headp /* no conversion needed, just use headp */

      if(conn->handler->protocol & PROTO_FAMILY_HTTP) {
        /*
         * https://datatracker.ietf.org/doc/html/rfc7230#section-3.1.2
         *
         * The response code is always a three-digit number in HTTP as the spec
         * says. We allow any three-digit number here, but we cannot make
         * guarantees on future behaviors since it isn't within the protocol.
         */
        char separator;
        char twoorthree[2];
        int httpversion = 0;
        char digit4 = 0;
        nc = sscanf(HEADER1,
                    " HTTP/%1d.%1d%c%3d%c",
                    &httpversion_major,
                    &httpversion,
                    &separator,
                    &k->httpcode,
                    &digit4);

        if(nc == 1 && httpversion_major >= 2 &&
           2 == sscanf(HEADER1, " HTTP/%1[23] %d", twoorthree, &k->httpcode)) {
          conn->httpversion = 0;
          nc = 4;
          separator = ' ';
        }

        /* There can only be a 4th response code digit stored in 'digit4' if
           all the other fields were parsed and stored first, so nc is 5 when
           digit4 a digit.

           The sscanf() line above will also allow zero-prefixed and negative
           numbers, so we check for that too here.
        */
        else if(ISDIGIT(digit4) || (nc >= 4 && k->httpcode < 100)) {
          failf(data, "Unsupported response code in HTTP response");
          return CURLE_UNSUPPORTED_PROTOCOL;
        }

        if((nc >= 4) && (' ' == separator)) {
          httpversion += 10 * httpversion_major;
          switch(httpversion) {
          case 10:
          case 11:
#ifdef USE_HTTP2
          case 20:
#endif
#ifdef ENABLE_QUIC
          case 30:
#endif
            conn->httpversion = (unsigned char)httpversion;
            break;
          default:
            failf(data, "Unsupported HTTP version (%u.%d) in response",
                  httpversion/10, httpversion%10);
            return CURLE_UNSUPPORTED_PROTOCOL;
          }

          if(k->upgr101 == UPGR101_RECEIVED) {
            /* supposedly upgraded to http2 now */
            if(conn->httpversion != 20)
              infof(data, "Lying server, not serving HTTP/2");
          }
          if(conn->httpversion < 20) {
            conn->bundle->multiuse = BUNDLE_NO_MULTIUSE;
            infof(data, "Mark bundle as not supporting multiuse");
          }
        }
        else if(!nc) {
          /* this is the real world, not a Nirvana
             NCSA 1.5.x returns this crap when asked for HTTP/1.1
          */
          nc = sscanf(HEADER1, " HTTP %3d", &k->httpcode);
          conn->httpversion = 10;

          /* If user has set option HTTP200ALIASES,
             compare header line against list of aliases
          */
          if(!nc) {
            statusline check =
              checkhttpprefix(data,
                              Curl_dyn_ptr(&data->state.headerb),
                              Curl_dyn_len(&data->state.headerb));
            if(check == STATUS_DONE) {
              nc = 1;
              k->httpcode = 200;
              conn->httpversion = 10;
            }
          }
        }
        else {
          failf(data, "Unsupported HTTP version in response");
          return CURLE_UNSUPPORTED_PROTOCOL;
        }
      }
      else if(conn->handler->protocol & CURLPROTO_RTSP) {
        char separator;
        int rtspversion;
        nc = sscanf(HEADER1,
                    " RTSP/%1d.%1d%c%3d",
                    &rtspversion_major,
                    &rtspversion,
                    &separator,
                    &k->httpcode);
        if((nc == 4) && (' ' == separator)) {
          conn->httpversion = 11; /* For us, RTSP acts like HTTP 1.1 */
        }
        else {
          nc = 0;
        }
      }

      if(nc) {
        result = Curl_http_statusline(data, conn);
        if(result)
          return result;
        writetype |= CLIENTWRITE_STATUS;
      }
      else {
        k->header = FALSE;   /* this is not a header line */
        break;
      }
    }

    result = verify_header(data);
    if(result)
      return result;

    result = Curl_http_header(data, conn, headp);
    if(result)
      return result;

    /*
     * End of header-checks. Write them to the client.
     */
    if(data->set.include_header)
      writetype |= CLIENTWRITE_BODY;
    if(k->httpcode/100 == 1)
      writetype |= CLIENTWRITE_1XX;

    Curl_debug(data, CURLINFO_HEADER_IN, headp,
               Curl_dyn_len(&data->state.headerb));

    result = Curl_client_write(data, writetype, headp,
                               Curl_dyn_len(&data->state.headerb));
    if(result)
      return result;

    data->info.header_size += Curl_dyn_len(&data->state.headerb);
    data->req.headerbytecount += Curl_dyn_len(&data->state.headerb);

    Curl_dyn_reset(&data->state.headerb);
  }
  while(*k->str); /* header line within buffer */

  /* We might have reached the end of the header part here, but
     there might be a non-header part left in the end of the read
     buffer. */

  return CURLE_OK;
}